

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData *
cfd::core::CryptoUtil::DecryptAes256Cbc
          (ByteData *__return_storage_ptr__,ByteData *key,ByteData *iv,ByteData *data)

{
  undefined8 bytes;
  pointer iv_00;
  pointer key_00;
  size_t sVar1;
  CfdException *pCVar2;
  int ret;
  undefined1 local_a8 [32];
  size_t written;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> iv_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_data;
  
  sVar1 = ByteData::GetDataSize(key);
  if (sVar1 != 0x20) {
    local_a8._0_8_ = "cfdcore_util.cpp";
    local_a8._8_4_ = 0x2cc;
    local_a8._16_8_ = "DecryptAes256Cbc";
    logger::log<>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"wally_aes key size NG.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_a8._0_8_ = local_a8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"DecryptAes256Cbc key size error.","");
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_a8);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar1 = ByteData::GetDataSize(data);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,sVar1,
             (allocator_type *)local_a8);
  ByteData::GetBytes(&key_data,key);
  ByteData::GetBytes(&iv_data,iv);
  key_00 = key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iv_00 = iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  written = 0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,data);
  bytes = local_a8._0_8_;
  sVar1 = ByteData::GetDataSize(data);
  ret = wally_aes_cbc(key_00,(long)key_data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)key_00,iv_00,
                      (long)iv_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)iv_00,(uchar *)bytes,
                      sVar1,2,output.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                      (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start,&written);
  if ((uchar *)local_a8._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_a8._0_8_);
  }
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,written);
    ByteData::ByteData(__return_storage_ptr__,&output);
    if (iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(iv_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(key_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_a8._0_8_ = "cfdcore_util.cpp";
  local_a8._8_4_ = 0x2dc;
  local_a8._16_8_ = "DecryptAes256Cbc";
  logger::log<int&>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,"wally_aes_cbc NG[{}].",&ret);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_a8._0_8_ = local_a8 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"DecryptAes256Cbc error.","")
  ;
  CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)local_a8);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData CryptoUtil::DecryptAes256Cbc(
    const ByteData &key, const ByteData &iv, const ByteData &data) {
  if (key.GetDataSize() != AES_KEY_LEN_256) {
    warn(CFD_LOG_SOURCE, "wally_aes key size NG.");
    throw CfdException(
        kCfdIllegalStateError, "DecryptAes256Cbc key size error.");
  }

  std::vector<uint8_t> output(data.GetDataSize());
  std::vector<uint8_t> key_data = key.GetBytes();
  std::vector<uint8_t> iv_data = iv.GetBytes();
  size_t written = 0;

  // Decrypt data using AES(CBC mode, PKCS#7 padding).
  int ret = wally_aes_cbc(
      key_data.data(), key_data.size(), iv_data.data(), iv_data.size(),
      data.GetBytes().data(), data.GetDataSize(), AES_FLAG_DECRYPT,
      output.data(), output.size(), &written);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_aes_cbc NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "DecryptAes256Cbc error.");
  }

  output.resize(written);
  return ByteData(output);
}